

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O2

ScalarFunction * duckdb::ListHasAllFun::GetFunction(void)

{
  LogicalType varargs;
  long lVar1;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffefc;
  FunctionNullHandling in_stack_ffffffffffffff08;
  allocator_type local_f1;
  code *bind_lambda;
  LogicalType local_d0;
  LogicalType local_b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_a0;
  LogicalType local_88;
  LogicalType local_70;
  LogicalType local_58 [2];
  
  LogicalType::LogicalType(&local_70,ANY);
  LogicalType::LIST(local_58,&local_70);
  LogicalType::LogicalType(&local_b8,ANY);
  LogicalType::LIST(local_58 + 1,&local_b8);
  __l._M_len = 2;
  __l._M_array = local_58;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_a0,__l,&local_f1);
  LogicalType::LogicalType(&local_d0,BOOLEAN);
  bind_lambda = ListHasAllFunction;
  LogicalType::LogicalType(&local_88,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_88;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffef4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffefc;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_a0,&local_d0,
             (scalar_function_t *)&stack0xffffffffffffff10,ListHasAnyOrAllBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,in_stack_ffffffffffffff08,bind_lambda);
  LogicalType::~LogicalType(&local_88);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffff10);
  LogicalType::~LogicalType(&local_d0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_a0);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_58[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType(&local_b8);
  LogicalType::~LogicalType(&local_70);
  return in_RDI;
}

Assistant:

ScalarFunction ListHasAllFun::GetFunction() {
	ScalarFunction fun({LogicalType::LIST(LogicalType::ANY), LogicalType::LIST(LogicalType::ANY)}, LogicalType::BOOLEAN,
	                   ListHasAllFunction, ListHasAnyOrAllBind);
	return fun;
}